

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void send_ssi_file(mg_connection *conn,char *path,mg_file *filep,int include_level)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ptrdiff_t pVar6;
  int *piVar7;
  uint uVar8;
  mg_file *filep_00;
  char *pcVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  bool bVar10;
  char *pcVar11;
  size_t len;
  int local_4278;
  uint local_4274;
  char *local_4270;
  mg_file file;
  char path_1 [512];
  char buf [8192];
  char file_name [8192];
  
  if (10 < include_level) {
    mg_cry_internal_wrap
              (conn,(mg_context *)0x0,(char *)filep,include_level,
               "SSI #include level is too deep (%s)");
    return;
  }
  local_4274 = include_level + 2;
  filep_00 = (mg_file *)(ulong)local_4274;
  local_4270 = path;
  do {
    while( true ) {
      while( true ) {
        len = 0;
        bVar10 = true;
        bVar1 = false;
        while( true ) {
          while( true ) {
            if (filep == (mg_file *)0x0) {
              return;
            }
            __stream = (FILE *)(filep->access).fp;
            iVar3 = (int)len;
            if ((__stream == (FILE *)0x0) || (iVar2 = fgetc(__stream), iVar2 == -1)) {
              if (iVar3 < 1) {
                return;
              }
              mg_write(conn,buf,len);
              return;
            }
            pcVar9 = (char *)(long)iVar3;
            if (!bVar10) break;
            if (iVar2 == 0x3c) {
              if (0 < iVar3) {
                mg_write(conn,buf,len);
              }
              buf[0] = '<';
              bVar10 = false;
              len = 1;
            }
            else {
              len = (size_t)(iVar3 + 1U);
              buf[(long)pcVar9] = (char)iVar2;
              bVar10 = true;
              if (iVar3 + 1U == 0x2000) {
                mg_write(conn,buf,0x2000);
                len = 0;
                bVar10 = true;
              }
            }
          }
          if (iVar2 == 0x3e) break;
          uVar8 = iVar3 + 1;
          filep_00 = (mg_file *)(ulong)uVar8;
          buf[(long)pcVar9] = (char)iVar2;
          if (uVar8 == 5) {
            iVar3 = bcmp(buf,"<!--#",5);
            if (iVar3 == 0) {
              bVar1 = true;
            }
            bVar10 = false;
            len = 5;
          }
          else {
            bVar10 = false;
            len = (size_t)uVar8;
            if (0x1ffd < iVar3) {
              mg_cry_internal_wrap
                        (conn,(mg_context *)0x0,pcVar9,uVar8,"%s: tag is too large",local_4270);
              return;
            }
          }
        }
        buf[(long)pcVar9] = '>';
        pcVar9 = pcVar9 + 1;
        if (bVar1) break;
        mg_write(conn,buf,(size_t)pcVar9);
      }
      buf[(long)pcVar9] = '\0';
      if (0xb < iVar3) break;
      if (8 < iVar3) goto LAB_00117474;
LAB_00117484:
      mg_cry_internal_wrap
                (conn,(mg_context *)0x0,pcVar9,(uint)filep_00,"%s: unknown SSI command: \"%s\"",
                 local_4270,buf);
    }
    iVar3 = bcmp(buf + 5,"include",7);
    pcVar9 = extraout_RDX;
    if (iVar3 == 0) {
      file.stat.is_directory = 0;
      file.stat.is_gzipped = 0;
      file.stat.location = 0;
      file.stat._28_4_ = 0;
      file.access.fp = (FILE *)0x0;
      file.stat.size = 0;
      file.stat.last_modified = 0;
      local_4278 = 0;
      pcVar9 = buf + 0xc;
      iVar3 = __isoc99_sscanf(pcVar9," virtual=\"%511[^\"]\"",file_name);
      if (iVar3 == 1) {
        file_name[0x1ff] = '\0';
        filep_00 = (mg_file *)0x200;
        iVar3 = 0x1298dc;
        mg_snprintf(conn,&local_4278,path_1,0x200,"%s/%s",conn->dom_ctx->config[0xf],file_name);
        pcVar4 = extraout_RDX_00;
        uVar8 = local_4274;
LAB_001175b1:
        if (local_4278 != 0) goto LAB_001175b8;
        iVar2 = mg_fopen((mg_connection *)path_1,(char *)0x1,(int)&file,filep_00);
        if (iVar2 == 0) {
          piVar7 = __errno_location();
          strerror(*piVar7);
          pcVar11 = "Cannot open SSI #include: [%s]: fopen(%s): %s";
          pcVar4 = extraout_RDX_04;
          goto LAB_001175c4;
        }
        fclose_on_exec(&file.access,conn);
        pVar6 = match_prefix_strlen(conn->dom_ctx->config[0x20],path_1);
        if (pVar6 < 1) {
          filep_00 = (mg_file *)0x7fffffffffffffff;
          send_file_data(conn,&file,0,0x7fffffffffffffff,iVar3);
        }
        else {
          filep_00 = (mg_file *)(ulong)uVar8;
          send_ssi_file(conn,path_1,&file,uVar8);
        }
        mg_fclose(&file.access);
      }
      else {
        iVar3 = __isoc99_sscanf(pcVar9," abspath=\"%511[^\"]\"",file_name);
        uVar8 = local_4274;
        pcVar11 = path_1;
        if (iVar3 == 1) {
          file_name[0x1ff] = '\0';
          filep_00 = (mg_file *)0x200;
LAB_001175a0:
          iVar3 = 0x12a663;
          mg_snprintf(conn,&local_4278,pcVar11,(size_t)filep_00,"%s",file_name);
          pcVar4 = extraout_RDX_03;
          goto LAB_001175b1;
        }
        iVar3 = __isoc99_sscanf(pcVar9," file=\"%511[^\"]\"",file_name);
        if ((iVar3 != 1) && (iVar3 = __isoc99_sscanf(pcVar9," \"%511[^\"]\"",file_name), iVar3 != 1)
           ) {
          pcVar11 = "Bad SSI #include: [%s]";
          pcVar4 = extraout_RDX_01;
          goto LAB_001175c4;
        }
        file_name[0x1ff] = '\0';
        filep_00 = (mg_file *)0x200;
        mg_snprintf(conn,&local_4278,pcVar11,0x200,"%s",local_4270);
        pcVar4 = extraout_RDX_02;
        if (local_4278 == 0) {
          pcVar4 = strrchr(pcVar11,0x2f);
          if (pcVar4 != (char *)0x0) {
            pcVar4[1] = '\0';
          }
          sVar5 = strlen(pcVar11);
          pcVar11 = path_1 + sVar5;
          filep_00 = (mg_file *)(0x200 - sVar5);
          goto LAB_001175a0;
        }
LAB_001175b8:
        pcVar11 = "SSI #include path length overflow: [%s]";
LAB_001175c4:
        mg_cry_internal_wrap(conn,(mg_context *)0x0,pcVar4,(uint)filep_00,pcVar11,pcVar9);
      }
    }
    else {
LAB_00117474:
      if (buf._5_4_ != 0x63657865) goto LAB_00117484;
      do_ssi_exec(conn,buf + 9);
    }
  } while( true );
}

Assistant:

static void
send_ssi_file(struct mg_connection *conn,
              const char *path,
              struct mg_file *filep,
              int include_level)
{
	char buf[MG_BUF_LEN];
	int ch, len, in_tag, in_ssi_tag;

	if (include_level > 10) {
		mg_cry_internal(conn, "SSI #include level is too deep (%s)", path);
		return;
	}

	in_tag = in_ssi_tag = len = 0;

	/* Read file, byte by byte, and look for SSI include tags */
	while ((ch = mg_fgetc(filep)) != EOF) {

		if (in_tag) {
			/* We are in a tag, either SSI tag or html tag */

			if (ch == '>') {
				/* Tag is closing */
				buf[len++] = '>';

				if (in_ssi_tag) {
					/* Handle SSI tag */
					buf[len] = 0;

					if ((len > 12) && !memcmp(buf + 5, "include", 7)) {
						do_ssi_include(conn, path, buf + 12, include_level + 1);
#if !defined(NO_POPEN)
					} else if ((len > 9) && !memcmp(buf + 5, "exec", 4)) {
						do_ssi_exec(conn, buf + 9);
#endif /* !NO_POPEN */
					} else {
						mg_cry_internal(conn,
						                "%s: unknown SSI "
						                "command: \"%s\"",
						                path,
						                buf);
					}
					len = 0;
					in_ssi_tag = in_tag = 0;

				} else {
					/* Not an SSI tag */
					/* Flush buffer */
					(void)mg_write(conn, buf, (size_t)len);
					len = 0;
					in_tag = 0;
				}

			} else {
				/* Tag is still open */
				buf[len++] = (char)(ch & 0xff);

				if ((len == 5) && !memcmp(buf, "<!--#", 5)) {
					/* All SSI tags start with <!--# */
					in_ssi_tag = 1;
				}

				if ((len + 2) > (int)sizeof(buf)) {
					/* Tag to long for buffer */
					mg_cry_internal(conn, "%s: tag is too large", path);
					return;
				}
			}

		} else {

			/* We are not in a tag yet. */
			if (ch == '<') {
				/* Tag is opening */
				in_tag = 1;

				if (len > 0) {
					/* Flush current buffer.
					 * Buffer is filled with "len" bytes. */
					(void)mg_write(conn, buf, (size_t)len);
				}
				/* Store the < */
				len = 1;
				buf[0] = '<';

			} else {
				/* No Tag */
				/* Add data to buffer */
				buf[len++] = (char)(ch & 0xff);
				/* Flush if buffer is full */
				if (len == (int)sizeof(buf)) {
					mg_write(conn, buf, (size_t)len);
					len = 0;
				}
			}
		}
	}

	/* Send the rest of buffered data */
	if (len > 0) {
		mg_write(conn, buf, (size_t)len);
	}
}